

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

GLint deqp::gls::LifetimeTests::details::getInteger(ContextWrapper *gl,GLenum queryParam)

{
  ostringstream *this;
  GLenum err;
  GLint ret;
  GLint local_194;
  undefined1 local_190 [384];
  
  local_194 = 0;
  glu::CallLogWrapper::glGetIntegerv(&gl->super_CallLogWrapper,queryParam,&local_194);
  err = glu::CallLogWrapper::glGetError(&gl->super_CallLogWrapper);
  glu::checkError(err,"gl.glGetIntegerv(queryParam, &ret)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x51);
  local_190._0_8_ = ((gl->m_ctx).m_testCtx)->m_log;
  this = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"// Single integer output: ",0x1a);
  std::ostream::operator<<(this,local_194);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  return local_194;
}

Assistant:

GLint getInteger (ContextWrapper& gl, GLenum queryParam)
{
	GLint ret = 0;
	GLU_CHECK_CALL_ERROR(
		gl.glGetIntegerv(queryParam, &ret),
		gl.glGetError());
	gl.log() << TestLog::Message << "// Single integer output: " << ret << TestLog::EndMessage;
	return ret;
}